

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O3

void __thiscall
wasm::SmallVector<wasm::HeapType,_10UL>::push_back
          (SmallVector<wasm::HeapType,_10UL> *this,HeapType *x)

{
  ulong uVar1;
  iterator __position;
  
  uVar1 = this->usedFixed;
  if (uVar1 < 10) {
    this->usedFixed = uVar1 + 1;
    (this->fixed)._M_elems[uVar1].id = x->id;
  }
  else {
    __position._M_current =
         (this->flexible).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->flexible).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
      _M_realloc_insert<wasm::HeapType_const&>
                ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&this->flexible,__position
                 ,x);
      return;
    }
    (__position._M_current)->id = x->id;
    (this->flexible).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }